

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall spvtools::opt::analysis::Type::operator==(Type *this,Type *other)

{
  Kind KVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  KVar1 = this->kind_;
  if (KVar1 != other->kind_) {
    return false;
  }
  if (KVar1 < kLast) {
    iVar3 = (*this->_vptr_Type[(ulong)KVar1 * 2 + 6])();
    bVar2 = IsSame((Type *)CONCAT44(extraout_var,iVar3),other);
    return bVar2;
  }
  __assert_fail("false && \"Unhandled type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                ,0xc0,"bool spvtools::opt::analysis::Type::operator==(const Type &) const");
}

Assistant:

bool Type::operator==(const Type& other) const {
  if (kind_ != other.kind_) return false;

  switch (kind_) {
#define DeclareKindCase(kind) \
  case k##kind:               \
    return As##kind()->IsSame(&other)
    DeclareKindCase(Void);
    DeclareKindCase(Bool);
    DeclareKindCase(Integer);
    DeclareKindCase(Float);
    DeclareKindCase(Vector);
    DeclareKindCase(Matrix);
    DeclareKindCase(Image);
    DeclareKindCase(Sampler);
    DeclareKindCase(SampledImage);
    DeclareKindCase(Array);
    DeclareKindCase(RuntimeArray);
    DeclareKindCase(NodePayloadArrayAMDX);
    DeclareKindCase(Struct);
    DeclareKindCase(Opaque);
    DeclareKindCase(Pointer);
    DeclareKindCase(Function);
    DeclareKindCase(Event);
    DeclareKindCase(DeviceEvent);
    DeclareKindCase(ReserveId);
    DeclareKindCase(Queue);
    DeclareKindCase(Pipe);
    DeclareKindCase(ForwardPointer);
    DeclareKindCase(PipeStorage);
    DeclareKindCase(NamedBarrier);
    DeclareKindCase(AccelerationStructureNV);
    DeclareKindCase(CooperativeMatrixNV);
    DeclareKindCase(CooperativeMatrixKHR);
    DeclareKindCase(CooperativeVectorNV);
    DeclareKindCase(RayQueryKHR);
    DeclareKindCase(HitObjectNV);
    DeclareKindCase(TensorLayoutNV);
    DeclareKindCase(TensorViewNV);
#undef DeclareKindCase
    default:
      assert(false && "Unhandled type");
      return false;
  }
}